

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Node * StripSpan(TidyDocImpl *doc,Node *span)

{
  Node *pNVar1;
  Node *local_30;
  Node *content;
  Node *prev;
  Node *node;
  Node *span_local;
  TidyDocImpl *doc_local;
  
  content = (Node *)0x0;
  prvTidyCleanWord2000(doc,span->content);
  pNVar1 = span->content;
  local_30 = pNVar1;
  if (span->prev == (Node *)0x0) {
    if (pNVar1 != (Node *)0x0) {
      local_30 = pNVar1->next;
      prvTidyRemoveNode(pNVar1);
      prvTidyInsertNodeBeforeElement(span,pNVar1);
      content = pNVar1;
    }
  }
  else {
    content = span->prev;
  }
  while (local_30 != (Node *)0x0) {
    pNVar1 = local_30->next;
    prvTidyRemoveNode(local_30);
    prvTidyInsertNodeAfterElement(content,local_30);
    content = local_30;
    local_30 = pNVar1;
  }
  if (span->next == (Node *)0x0) {
    span->parent->last = content;
  }
  pNVar1 = span->next;
  span->content = (Node *)0x0;
  prvTidyDiscardElement(doc,span);
  return pNVar1;
}

Assistant:

static Node* StripSpan( TidyDocImpl* doc, Node* span )
{
    Node *node, *prev = NULL, *content;

    /*
     deal with span elements that have content
     by splicing the content in place of the span
     after having processed it
    */

    TY_(CleanWord2000)( doc, span->content );
    content = span->content;

    if (span->prev)
        prev = span->prev;
    else if (content)
    {
        node = content;
        content = content->next;
        TY_(RemoveNode)(node);
        TY_(InsertNodeBeforeElement)(span, node);
        prev = node;
    }

    while (content)
    {
        node = content;
        content = content->next;
        TY_(RemoveNode)(node);
        TY_(InsertNodeAfterElement)(prev, node);
        prev = node;
    }

    if (span->next == NULL)
        span->parent->last = prev;

    node = span->next;
    span->content = NULL;
    TY_(DiscardElement)( doc, span );
    return node;
}